

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void NtoS(int n,tmbstr str)

{
  tmbchar *ptVar1;
  long lVar2;
  long lVar3;
  tmbchar buf [40];
  
  lVar2 = 0;
  while( true ) {
    buf[lVar2] = (char)(n % 10) + '0';
    if (n + 9U < 0x13) break;
    lVar2 = lVar2 + 1;
    n = n / 10;
  }
  ptVar1 = str + ((int)lVar2 - lVar2);
  for (lVar3 = lVar2; -1 < lVar3; lVar3 = lVar3 + -1) {
    *ptVar1 = buf[lVar3];
    ptVar1 = ptVar1 + 1;
  }
  str[lVar2 + 1] = '\0';
  return;
}

Assistant:

static void NtoS(int n, tmbstr str)
{
    tmbchar buf[40];
    int i;
    
    for (i = 0;; ++i)
    {
        buf[i] = (tmbchar)( (n % 10) + '0' );
        
        n = n / 10;
        
        if (n == 0)
            break;
    }
    
    n = i;
    
    while (i >= 0)
    {
        str[n-i] = buf[i];
        --i;
    }
    
    str[n+1] = '\0';
}